

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_enclosing
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *param,REF_INT *cell,
          REF_DBL *bary)

{
  REF_INT RVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong unaff_RBX;
  REF_GEOM ref_geom;
  REF_INT RVar6;
  char *pcVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  REF_LIST ref_list;
  REF_DBL current_bary [3];
  REF_INT nodes [27];
  REF_LIST local_118;
  REF_CELL local_110;
  REF_DBL *local_108;
  double local_100;
  REF_DBL *local_f8;
  REF_INT local_ec;
  REF_GEOM local_e8;
  int *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  REF_INT local_b8 [28];
  REF_DBL local_48;
  REF_DBL local_40;
  undefined8 uStack_38;
  
  local_100 = (double)CONCAT44(local_100._4_4_,id);
  ref_geom = ref_facelift->grid->geom;
  *cell = -1;
  *bary = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;
  local_e0 = cell;
  if (type == 1) {
    uVar4 = ref_list_create(&local_118);
    unaff_RBX = (ulong)uVar4;
    if (uVar4 != 0) {
      pcVar7 = "create list";
      uVar5 = 0x224;
      goto LAB_001dfc01;
    }
    local_110 = ref_facelift->edg_cell;
    local_48 = *param;
    local_40 = 0.0;
    uStack_38 = 0;
    local_108 = param;
    uVar4 = ref_search_touching(ref_facelift->edge_search[(long)local_100._0_4_ + -1],local_118,
                                &local_48,1e-12);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x22b,"ref_facelift_enclosing",(ulong)uVar4,"touching");
      unaff_RBX = (ulong)uVar4;
    }
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
    if (local_118->n < 1) {
      uVar4 = ref_list_free(local_118);
      if (uVar4 == 0) {
        return 0;
      }
      unaff_RBX = (ulong)uVar4;
      pcVar7 = "free list";
      uVar5 = 0x22d;
      goto LAB_001dfc01;
    }
    local_f8 = bary;
    local_e8 = ref_geom;
    if (local_118->n < 1) {
      RVar6 = -1;
    }
    else {
      RVar6 = -1;
      uVar9 = 0;
      uVar10 = 0xc08f3800;
      lVar8 = 0;
      do {
        local_c0 = (double)CONCAT44(uVar10,uVar9);
        RVar1 = local_118->value[lVar8];
        local_ec = RVar6;
        uVar4 = ref_cell_nodes(local_110,RVar1,local_b8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x234,"ref_facelift_enclosing",(ulong)uVar4,"cell");
          unaff_RBX = (ulong)uVar4;
        }
        if (uVar4 != 0) {
          return (REF_STATUS)unaff_RBX;
        }
        local_b8[2] = local_b8[local_110->node_per];
        uVar4 = ref_geom_bary2(local_e8,local_b8,*local_108,&local_d8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x236,"ref_facelift_enclosing",(ulong)uVar4,"bary");
          unaff_RBX = (ulong)uVar4;
        }
        if (uVar4 != 0) {
          return (REF_STATUS)unaff_RBX;
        }
        uVar9 = SUB84(local_d8,0);
        uVar10 = (undefined4)((ulong)local_d8 >> 0x20);
        if (local_d0 <= local_d8) {
          uVar9 = SUB84(local_d0,0);
          uVar10 = (undefined4)((ulong)local_d0 >> 0x20);
        }
        bVar2 = (double)CONCAT44(uVar10,uVar9) != local_c0;
        bVar3 = local_c0 <= (double)CONCAT44(uVar10,uVar9);
        RVar6 = local_ec;
        if (bVar3 && bVar2 || local_ec == -1) {
          RVar6 = RVar1;
        }
        if (((NAN((double)CONCAT44(uVar10,uVar9)) || NAN(local_c0)) || (!bVar3 || !bVar2)) &&
            local_ec != -1) {
          uVar9 = SUB84(local_c0,0);
          uVar10 = (undefined4)((ulong)local_c0 >> 0x20);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_118->n);
    }
    if (RVar6 == -1) {
      uVar5 = 0x23e;
      goto LAB_001e02e2;
    }
    *local_e0 = RVar6;
    uVar4 = ref_cell_nodes(local_110,RVar6,local_b8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x241,"ref_facelift_enclosing",(ulong)uVar4,"cell");
      unaff_RBX = (ulong)uVar4;
    }
    ref_geom = local_e8;
    bary = local_f8;
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
    local_b8[2] = local_b8[local_110->node_per];
    uVar4 = ref_geom_bary2(local_e8,local_b8,*local_108,local_f8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x243,"ref_facelift_enclosing",(ulong)uVar4,"bary");
      unaff_RBX = (ulong)uVar4;
    }
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
    uVar4 = ref_list_free(local_118);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x245,"ref_facelift_enclosing",(ulong)uVar4,"free list");
      unaff_RBX = (ulong)uVar4;
    }
    param = local_108;
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
  }
  if (type == 2) {
    uVar4 = ref_list_create(&local_118);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x249,"ref_facelift_enclosing",(ulong)uVar4,"create list");
      unaff_RBX = (ulong)uVar4;
    }
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
    local_110 = ref_facelift->tri_cell;
    local_48 = *param;
    local_40 = param[1];
    uStack_38 = 0;
    uVar4 = ref_search_touching(ref_facelift->face_search[(long)local_100._0_4_ + -1],local_118,
                                &local_48,1e-12);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x250,"ref_facelift_enclosing",(ulong)uVar4,"touching");
      unaff_RBX = (ulong)uVar4;
    }
    if (uVar4 != 0) {
      return (REF_STATUS)unaff_RBX;
    }
    if (local_118->n < 1) {
      uVar4 = ref_list_free(local_118);
      if (uVar4 != 0) {
        unaff_RBX = (ulong)uVar4;
        pcVar7 = "free list";
        uVar5 = 0x253;
LAB_001dfc01:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               uVar5,"ref_facelift_enclosing",unaff_RBX,pcVar7);
        return (REF_STATUS)unaff_RBX;
      }
    }
    else {
      local_108 = param;
      local_f8 = bary;
      if (local_118->n < 1) {
        RVar6 = -1;
      }
      else {
        RVar6 = -1;
        uVar9 = 0;
        uVar10 = 0xc08f3800;
        lVar8 = 0;
        do {
          local_100 = (double)CONCAT44(uVar10,uVar9);
          RVar1 = local_118->value[lVar8];
          uVar4 = ref_cell_nodes(local_110,RVar1,local_b8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x25a,"ref_facelift_enclosing",(ulong)uVar4,"cell");
            unaff_RBX = (ulong)uVar4;
          }
          if (uVar4 != 0) {
            return (REF_STATUS)unaff_RBX;
          }
          local_b8[3] = local_b8[local_110->node_per];
          uVar4 = ref_geom_bary3(ref_geom,local_b8,local_108,&local_d8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x25c,"ref_facelift_enclosing",(ulong)uVar4,"bary");
            unaff_RBX = (ulong)uVar4;
          }
          if (uVar4 != 0) {
            return (REF_STATUS)unaff_RBX;
          }
          uVar9 = SUB84(local_d8,0);
          uVar10 = (undefined4)((ulong)local_d8 >> 0x20);
          if (local_d0 <= local_d8) {
            uVar9 = SUB84(local_d0,0);
            uVar10 = (undefined4)((ulong)local_d0 >> 0x20);
          }
          if (local_c8 <= (double)CONCAT44(uVar10,uVar9)) {
            uVar9 = SUB84(local_c8,0);
            uVar10 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          if (((double)CONCAT44(uVar10,uVar9) < local_100 ||
              (double)CONCAT44(uVar10,uVar9) == local_100) && RVar6 != -1) {
            uVar9 = SUB84(local_100,0);
            uVar10 = (undefined4)((ulong)local_100 >> 0x20);
            RVar1 = RVar6;
          }
          RVar6 = RVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_118->n);
      }
      if (RVar6 == -1) {
        uVar5 = 0x267;
LAB_001e02e2:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               uVar5,"ref_facelift_enclosing","failed to find cell");
        return 1;
      }
      *local_e0 = RVar6;
      uVar4 = ref_cell_nodes(local_110,RVar6,local_b8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x26a,"ref_facelift_enclosing",(ulong)uVar4,"cell");
        return uVar4;
      }
      local_b8[3] = local_b8[local_110->node_per];
      uVar4 = ref_geom_bary3(ref_geom,local_b8,local_108,local_f8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x26c,"ref_facelift_enclosing",(ulong)uVar4,"bary");
        return uVar4;
      }
      uVar4 = ref_list_free(local_118);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x270,"ref_facelift_enclosing",(ulong)uVar4,"free list");
        return uVar4;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_enclosing(REF_FACELIFT ref_facelift,
                                          REF_INT type, REF_INT id,
                                          REF_DBL *param, REF_INT *cell,
                                          REF_DBL *bary) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_CELL ref_cell;
  REF_DBL parampad[3];
  REF_DBL fuzz = 1.0e-12;
  REF_INT item, candidate, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL current_bary[3], best_bary, min_bary;
  REF_INT best_candidate;
  REF_BOOL verbose = REF_FALSE;

  *cell = REF_EMPTY;
  bary[0] = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;

  if (REF_GEOM_EDGE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_edge_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_edg(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = 0.0;
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary2(ref_geom, nodes, param[0], current_bary), "bary");
      min_bary = MIN(current_bary[0], current_bary[1]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary2(ref_geom, nodes, param[0], bary), "bary");

    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_GEOM_FACE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_face_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_tri(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = param[1];
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (verbose) printf("n touch %d\n", ref_list_n(ref_list));
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary3(ref_geom, nodes, param, current_bary), "bary");
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (verbose)
        printf("bary %e %e %e\n", current_bary[0], current_bary[1],
               current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary3(ref_geom, nodes, param, bary), "bary");

    if (verbose) printf("best %e %e %e\n", bary[0], bary[1], bary[2]);

    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}